

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvm.cpp
# Opt level: O1

Value * __thiscall Kvm::extendEnvironment(Kvm *this,Value *vars,Value *vals,Value *base_env)

{
  Kgc *this_00;
  pointer *ppppVVar1;
  Value *pVVar2;
  Value *pVVar3;
  Value *result;
  Value *local_38;
  
  local_38 = (Value *)0x0;
  this_00 = &this->gc_;
  Kgc::pushLocalStackRoot(this_00,&local_38);
  pVVar2 = Kgc::allocValue(this_00,CELL);
  pVVar2[1]._vptr_Value = (_func_int **)vars;
  *(Value **)&pVVar2[1].type_ = vals;
  local_38 = pVVar2;
  pVVar3 = Kgc::allocValue(this_00,CELL);
  pVVar3[1]._vptr_Value = (_func_int **)pVVar2;
  *(Value **)&pVVar3[1].type_ = base_env;
  ppppVVar1 = &(this->gc_).localStackRoots_.
               super__Vector_base<const_Value_**,_std::allocator<const_Value_**>_>._M_impl.
               super__Vector_impl_data._M_finish;
  *ppppVVar1 = *ppppVVar1 + -1;
  return pVVar3;
}

Assistant:

const Value* Kvm::extendEnvironment(const Value *vars, const Value *vals, const Value *base_env)
{
    const Value *result = nullptr;
    gc_.pushLocalStackRoot(&result);
    
    result = makeFrame(vars, vals);
    result = makeCell(result, base_env);
    
    gc_.popLocalStackRoot();
    return result;
}